

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void filterScanline(uchar *out,uchar *scanline,uchar *prevline,size_t length,size_t bytewidth,
                   uchar filterType)

{
  uchar uVar1;
  ulong uVar2;
  uchar uVar3;
  size_t local_40;
  size_t i;
  uchar filterType_local;
  size_t bytewidth_local;
  size_t length_local;
  uchar *prevline_local;
  uchar *scanline_local;
  uchar *out_local;
  
  switch(filterType) {
  case '\0':
    for (local_40 = 0; local_40 != length; local_40 = local_40 + 1) {
      out[local_40] = scanline[local_40];
    }
    break;
  case '\x01':
    for (local_40 = 0; uVar2 = bytewidth, local_40 != bytewidth; local_40 = local_40 + 1) {
      out[local_40] = scanline[local_40];
    }
    while (local_40 = uVar2, local_40 < length) {
      out[local_40] = scanline[local_40] - scanline[local_40 - bytewidth];
      uVar2 = local_40 + 1;
    }
    break;
  case '\x02':
    if (prevline == (uchar *)0x0) {
      for (local_40 = 0; local_40 != length; local_40 = local_40 + 1) {
        out[local_40] = scanline[local_40];
      }
    }
    else {
      for (local_40 = 0; local_40 != length; local_40 = local_40 + 1) {
        out[local_40] = scanline[local_40] - prevline[local_40];
      }
    }
    break;
  case '\x03':
    if (prevline == (uchar *)0x0) {
      for (local_40 = 0; uVar2 = bytewidth, local_40 != bytewidth; local_40 = local_40 + 1) {
        out[local_40] = scanline[local_40];
      }
      while (local_40 = uVar2, local_40 < length) {
        out[local_40] = scanline[local_40] - (char)((int)(uint)scanline[local_40 - bytewidth] >> 1);
        uVar2 = local_40 + 1;
      }
    }
    else {
      for (local_40 = 0; uVar2 = bytewidth, local_40 != bytewidth; local_40 = local_40 + 1) {
        out[local_40] = scanline[local_40] - (char)((int)(uint)prevline[local_40] >> 1);
      }
      while (local_40 = uVar2, local_40 < length) {
        out[local_40] =
             scanline[local_40] -
             (char)((int)((uint)scanline[local_40 - bytewidth] + (uint)prevline[local_40]) >> 1);
        uVar2 = local_40 + 1;
      }
    }
    break;
  case '\x04':
    if (prevline == (uchar *)0x0) {
      for (local_40 = 0; uVar2 = bytewidth, local_40 != bytewidth; local_40 = local_40 + 1) {
        out[local_40] = scanline[local_40];
      }
      while (local_40 = uVar2, local_40 < length) {
        out[local_40] = scanline[local_40] - scanline[local_40 - bytewidth];
        uVar2 = local_40 + 1;
      }
    }
    else {
      for (local_40 = 0; uVar2 = bytewidth, local_40 != bytewidth; local_40 = local_40 + 1) {
        out[local_40] = scanline[local_40] - prevline[local_40];
      }
      while (local_40 = uVar2, local_40 < length) {
        uVar1 = scanline[local_40];
        uVar3 = paethPredictor((ushort)scanline[local_40 - bytewidth],(ushort)prevline[local_40],
                               (ushort)prevline[local_40 - bytewidth]);
        out[local_40] = uVar1 - uVar3;
        uVar2 = local_40 + 1;
      }
    }
  }
  return;
}

Assistant:

static void filterScanline(unsigned char* out, const unsigned char* scanline, const unsigned char* prevline,
                           size_t length, size_t bytewidth, unsigned char filterType)
{
  size_t i;
  switch(filterType)
  {
    case 0: /*None*/
      for(i = 0; i != length; ++i) out[i] = scanline[i];
      break;
    case 1: /*Sub*/
      for(i = 0; i != bytewidth; ++i) out[i] = scanline[i];
      for(i = bytewidth; i < length; ++i) out[i] = scanline[i] - scanline[i - bytewidth];
      break;
    case 2: /*Up*/
      if(prevline)
      {
        for(i = 0; i != length; ++i) out[i] = scanline[i] - prevline[i];
      }
      else
      {
        for(i = 0; i != length; ++i) out[i] = scanline[i];
      }
      break;
    case 3: /*Average*/
      if(prevline)
      {
        for(i = 0; i != bytewidth; ++i) out[i] = scanline[i] - (prevline[i] >> 1);
        for(i = bytewidth; i < length; ++i) out[i] = scanline[i] - ((scanline[i - bytewidth] + prevline[i]) >> 1);
      }
      else
      {
        for(i = 0; i != bytewidth; ++i) out[i] = scanline[i];
        for(i = bytewidth; i < length; ++i) out[i] = scanline[i] - (scanline[i - bytewidth] >> 1);
      }
      break;
    case 4: /*Paeth*/
      if(prevline)
      {
        /*paethPredictor(0, prevline[i], 0) is always prevline[i]*/
        for(i = 0; i != bytewidth; ++i) out[i] = (scanline[i] - prevline[i]);
        for(i = bytewidth; i < length; ++i)
        {
          out[i] = (scanline[i] - paethPredictor(scanline[i - bytewidth], prevline[i], prevline[i - bytewidth]));
        }
      }
      else
      {
        for(i = 0; i != bytewidth; ++i) out[i] = scanline[i];
        /*paethPredictor(scanline[i - bytewidth], 0, 0) is always scanline[i - bytewidth]*/
        for(i = bytewidth; i < length; ++i) out[i] = (scanline[i] - scanline[i - bytewidth]);
      }
      break;
    default: return; /*unexisting filter type given*/
  }
}